

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::absF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary<2,_&wasm::Literal::getLanesF64x2,_&wasm::Literal::abs,_&wasm::passThrough>
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::abs>(*this);
}